

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  pointer pAVar1;
  size_type sVar2;
  size_type sVar3;
  Option *option;
  long lVar4;
  pointer pOVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  iterator __begin1;
  long lVar8;
  pointer pOVar9;
  allocator<char> local_b9;
  pointer local_b8;
  string line;
  string flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  lVar8 = 0x20;
  uVar7 = 0;
  while( true ) {
    pAVar1 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->arguments_).
                  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
    if ((ulong)(lVar4 / 0x50) <= uVar7) break;
    uVar6 = (ulong)*(uint *)((long)&(pAVar1->name)._M_dataplus._M_p + lVar8);
    if (uVar6 < 3) {
      printf(&DAT_00171b0c + *(int *)(&DAT_00171b0c + uVar6 * 4),
             *(undefined8 *)((long)pAVar1 + lVar8 + -0x20),lVar4 % 0x50);
    }
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x50;
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  local_b8 = (this->options_).
             super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = 0;
  pOVar9 = (this->options_).
           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pOVar5 = pOVar9; pOVar5 != local_b8; pOVar5 = pOVar5 + 1) {
    sVar2 = (pOVar5->long_name)._M_string_length;
    if (sVar2 != 0) {
      sVar3 = (pOVar5->metavar)._M_string_length;
      lVar8 = sVar3 + 1;
      if (sVar3 == 0) {
        lVar8 = 0;
      }
      uVar6 = lVar8 + sVar2;
      if (uVar7 < uVar6) {
        uVar7 = uVar6;
      }
    }
  }
  do {
    if (pOVar9 == local_b8) {
      return;
    }
    if (pOVar9->short_name == '\0') {
      if ((pOVar9->long_name)._M_string_length != 0) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::append((char *)&line);
        goto LAB_00123fee;
      }
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"  -",&local_b9);
      std::operator+(&local_50,&local_70,pOVar9->short_name);
      std::operator+(&flag,&local_50,", ");
      std::__cxx11::string::append((string *)&line);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
LAB_00123fee:
      flag._M_dataplus._M_p = (pointer)&flag.field_2;
      flag._M_string_length = 0;
      flag.field_2._M_local_buf[0] = '\0';
      if ((pOVar9->long_name)._M_string_length != 0) {
        std::__cxx11::string::assign((char *)&flag);
        if ((pOVar9->metavar)._M_string_length == 0) {
          std::__cxx11::string::append((string *)&flag);
        }
        else {
          std::operator+(&local_70,&pOVar9->long_name,'=');
          std::operator+(&local_50,&local_70,&pOVar9->metavar);
          std::__cxx11::string::append((string *)&flag);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_70,((char)uVar7 + '\n') - (char)flag._M_string_length);
      std::operator+(&local_50,&flag,&local_70);
      std::__cxx11::string::append((string *)&line);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if ((pOVar9->help)._M_string_length != 0) {
        std::__cxx11::string::append((string *)&line);
      }
      puts(line._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    pOVar9 = pOVar9 + 1;
  } while( true );
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;

      case ArgumentCount::ZeroOrMore:
        printf(" [%s]...", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}